

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall Omega_h::project_metrics(Omega_h *this,Mesh *mesh,Reals *e2m)

{
  Reals *mesh_00;
  LO nmetrics;
  Int IVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar2;
  Reals RVar3;
  Read<double> local_78;
  Read<double> local_68;
  Read<double> local_58 [2];
  Read<double> local_38;
  Int local_24;
  Reals *pRStack_20;
  Int metric_dim;
  Reals *e2m_local;
  Mesh *mesh_local;
  
  pRStack_20 = e2m;
  e2m_local = (Reals *)mesh;
  mesh_local = (Mesh *)this;
  nmetrics = Mesh::nelems(mesh);
  Read<double>::Read(&local_38,e2m);
  IVar1 = get_metrics_dim(nmetrics,&local_38);
  Read<double>::~Read(&local_38);
  mesh_00 = e2m_local;
  local_24 = IVar1;
  if (IVar1 == 3) {
    Read<double>::Read(local_58,e2m);
    project_metrics_dim<3>(this,(Mesh *)mesh_00,local_58);
    Read<double>::~Read(local_58);
    pvVar2 = extraout_RDX;
  }
  else if (IVar1 == 2) {
    Read<double>::Read(&local_68,e2m);
    project_metrics_dim<2>(this,(Mesh *)mesh_00,&local_68);
    Read<double>::~Read(&local_68);
    pvVar2 = extraout_RDX_00;
  }
  else {
    if (IVar1 != 1) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
           ,0xfb);
    }
    Read<double>::Read(&local_78,e2m);
    project_metrics_dim<1>(this,(Mesh *)mesh_00,&local_78);
    Read<double>::~Read(&local_78);
    pvVar2 = extraout_RDX_01;
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals project_metrics(Mesh* mesh, Reals e2m) {
  auto metric_dim = get_metrics_dim(mesh->nelems(), e2m);
  if (metric_dim == 3)
    return project_metrics_dim<3>(mesh, e2m);
  else if (metric_dim == 2)
    return project_metrics_dim<2>(mesh, e2m);
  else if (metric_dim == 1)
    return project_metrics_dim<1>(mesh, e2m);
  else
    OMEGA_H_NORETURN(Reals());
}